

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_error.cpp
# Opt level: O1

void __thiscall
duckdb::CSVErrorHandler::FillRejectsTable
          (CSVErrorHandler *this,InternalAppender *errors_appender,idx_t file_idx,idx_t scan_idx,
          CSVFileScan *file,CSVRejectsTable *rejects,MultiFileBindData *bind_data,idx_t limit)

{
  ulong __n;
  char (*pacVar1) [4];
  pointer pcVar2;
  string_t value;
  string_t value_00;
  string_t value_01;
  int iVar3;
  CSVErrorHandler *pCVar4;
  idx_t iVar5;
  const_reference pvVar6;
  anon_union_16_2_67f50693_for_value *paVar7;
  CSVErrorType extraout_DL;
  CSVErrorType extraout_DL_00;
  CSVErrorType CVar8;
  optional_idx *this_00;
  pointer pCVar9;
  LogicalType *type;
  Value *this_01;
  anon_union_16_2_67f50693_for_value local_290;
  anon_union_16_2_67f50693_for_value local_280;
  uint local_270;
  undefined4 uStack_26c;
  undefined4 uStack_268;
  undefined4 uStack_264;
  uint local_260;
  undefined4 uStack_25c;
  undefined4 uStack_258;
  undefined4 uStack_254;
  uint local_250;
  undefined4 uStack_24c;
  undefined4 uStack_248;
  undefined4 uStack_244;
  pthread_mutex_t *local_240;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *local_238;
  idx_t local_230;
  idx_t local_228;
  shared_ptr<duckdb::CSVErrorHandler,_true> *local_220;
  ulong local_218;
  pointer local_210;
  string local_208;
  LogicalType local_1e8;
  LogicalType local_1d0;
  LogicalType local_1b8;
  LogicalType local_1a0;
  LogicalType local_188;
  Value local_170;
  Value local_130;
  Value local_f0;
  Value local_b0;
  Value local_70;
  
  local_230 = file_idx;
  local_228 = scan_idx;
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar3 != 0) {
    ::std::__throw_system_error(iVar3);
  }
  local_220 = &file->error_handler;
  local_240 = (pthread_mutex_t *)this;
  pCVar4 = shared_ptr<duckdb::CSVErrorHandler,_true>::operator->(local_220);
  pCVar9 = (pCVar4->errors).super_vector<duckdb::CSVError,_std::allocator<duckdb::CSVError>_>.
           super__Vector_base<duckdb::CSVError,_std::allocator<duckdb::CSVError>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_210 = (pCVar4->errors).super_vector<duckdb::CSVError,_std::allocator<duckdb::CSVError>_>.
              super__Vector_base<duckdb::CSVError,_std::allocator<duckdb::CSVError>_>._M_impl.
              super__Vector_impl_data._M_finish;
  if (pCVar9 != local_210) {
    local_218 = limit - 1;
    local_238 = &bind_data->names;
    this_00 = &pCVar9->byte_position;
    do {
      iVar3 = 3;
      if ((*(CSVErrorType *)(this_00 + -9) < 10) &&
         ((0x35dU >> (*(CSVErrorType *)(this_00 + -9) & 0x1f) & 1) != 0)) {
        iVar3 = 0;
        if (rejects->count <= local_218) {
          rejects->count = rejects->count + 1;
          pCVar4 = shared_ptr<duckdb::CSVErrorHandler,_true>::operator->(local_220);
          iVar5 = GetLineInternal(pCVar4,(LinesPerBoundary *)(this_00 + -3));
          __n = this_00[-8].index;
          BaseAppender::BeginRow(&errors_appender->super_BaseAppender);
          BaseAppender::Append<unsigned_long>(&errors_appender->super_BaseAppender,local_228);
          BaseAppender::Append<unsigned_long>(&errors_appender->super_BaseAppender,local_230);
          BaseAppender::Append<unsigned_long>(&errors_appender->super_BaseAppender,iVar5);
          BaseAppender::Append<unsigned_long>
                    (&errors_appender->super_BaseAppender,this_00[-1].index + 1);
          if (this_00->index == 0xffffffffffffffff) {
            LogicalType::LogicalType(&local_1d0,SQLNULL);
            Value::Value(&local_70,&local_1d0);
            BaseAppender::Append<duckdb::Value>(&errors_appender->super_BaseAppender,&local_70);
            Value::~Value(&local_70);
            LogicalType::~LogicalType(&local_1d0);
          }
          else {
            iVar5 = optional_idx::GetIndex(this_00);
            BaseAppender::Append<unsigned_long>(&errors_appender->super_BaseAppender,iVar5 + 1);
          }
          if (*(CSVErrorType *)(this_00 + -9) == MAXIMUM_LINE_SIZE) {
            LogicalType::LogicalType(&local_1e8,SQLNULL);
            Value::Value(&local_b0,&local_1e8);
            BaseAppender::Append<duckdb::Value>(&errors_appender->super_BaseAppender,&local_b0);
            Value::~Value(&local_b0);
            LogicalType::~LogicalType(&local_1e8);
          }
          else {
            BaseAppender::Append<unsigned_long>(&errors_appender->super_BaseAppender,__n + 1);
          }
          CVar8 = *(CSVErrorType *)(this_00 + -9);
          if (CVar8 == TOO_FEW_COLUMNS) {
            if ((ulong)((long)(bind_data->names).
                              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(bind_data->names).
                              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 5) <= __n + 1) {
              LogicalType::LogicalType(&local_1a0,SQLNULL);
              this_01 = &local_130;
              type = &local_1a0;
              Value::Value(this_01,type);
              BaseAppender::Append<duckdb::Value>(&errors_appender->super_BaseAppender,this_01);
              goto LAB_015478f8;
            }
            pvVar6 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                     ::operator[](local_238,__n + 1);
            pacVar1 = (char (*) [4])(pvVar6->_M_dataplus)._M_p;
            local_280.pointer.length = (uint32_t)pvVar6->_M_string_length;
            if (local_280.pointer.length < 0xd) {
              local_280._12_4_ = 0;
              local_280.pointer.prefix[0] = '\0';
              local_280.pointer.prefix[1] = '\0';
              local_280.pointer.prefix[2] = '\0';
              local_280.pointer.prefix[3] = '\0';
              local_280._8_4_ = 0;
              paVar7 = &local_280;
              if (local_280.pointer.length == 0) goto LAB_01547a98;
              switchD_012e1ce8::default
                        (local_280.pointer.prefix,pacVar1,(ulong)(local_280.pointer.length & 0xf));
            }
            else {
              local_280.pointer.prefix = *pacVar1;
              local_280._8_4_ = SUB84(pacVar1,0);
              local_280._12_4_ = (undefined4)((ulong)pacVar1 >> 0x20);
            }
            paVar7 = &local_280;
LAB_01547a98:
            BaseAppender::Append<duckdb::string_t>
                      (&errors_appender->super_BaseAppender,(string_t)paVar7->pointer);
            CVar8 = extraout_DL_00;
          }
          else {
            if ((CVar8 == MAXIMUM_LINE_SIZE) || (CVar8 == TOO_MANY_COLUMNS)) {
              LogicalType::LogicalType(&local_188,SQLNULL);
              this_01 = &local_f0;
              type = &local_188;
              Value::Value(this_01,type);
              BaseAppender::Append<duckdb::Value>(&errors_appender->super_BaseAppender,this_01);
            }
            else {
              if (__n < (ulong)((long)(bind_data->names).
                                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(bind_data->names).
                                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 5)) {
                pvVar6 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                         ::operator[](local_238,__n);
                pacVar1 = (char (*) [4])(pvVar6->_M_dataplus)._M_p;
                local_290.pointer.length = (uint32_t)pvVar6->_M_string_length;
                if (local_290.pointer.length < 0xd) {
                  local_290._12_4_ = 0;
                  local_290.pointer.prefix[0] = '\0';
                  local_290.pointer.prefix[1] = '\0';
                  local_290.pointer.prefix[2] = '\0';
                  local_290.pointer.prefix[3] = '\0';
                  local_290._8_4_ = 0;
                  paVar7 = &local_290;
                  if (local_290.pointer.length == 0) goto LAB_01547a98;
                  switchD_012e1ce8::default
                            (local_290.pointer.prefix,pacVar1,
                             (ulong)(local_290.pointer.length & 0xf));
                }
                else {
                  local_290.pointer.prefix = *pacVar1;
                  local_290._8_4_ = SUB84(pacVar1,0);
                  local_290._12_4_ = (undefined4)((ulong)pacVar1 >> 0x20);
                }
                paVar7 = &local_290;
                goto LAB_01547a98;
              }
              LogicalType::LogicalType(&local_1b8,SQLNULL);
              this_01 = &local_170;
              type = &local_1b8;
              Value::Value(this_01,type);
              BaseAppender::Append<duckdb::Value>(&errors_appender->super_BaseAppender,this_01);
            }
LAB_015478f8:
            Value::~Value(this_01);
            LogicalType::~LogicalType(type);
            CVar8 = extraout_DL;
          }
          CSVErrorTypeToEnum_abi_cxx11_
                    (&local_208,(duckdb *)(ulong)*(CSVErrorType *)(this_00 + -9),CVar8);
          local_250 = (uint)local_208._M_string_length;
          if (local_250 < 0xd) {
            uStack_244 = 0;
            uStack_24c = 0;
            uStack_248 = 0;
            if (local_250 != 0) {
              switchD_012e1ce8::default
                        (&uStack_24c,local_208._M_dataplus._M_p,(ulong)(local_250 & 0xf));
            }
          }
          else {
            uStack_24c = *(undefined4 *)local_208._M_dataplus._M_p;
            uStack_248 = SUB84(local_208._M_dataplus._M_p,0);
            uStack_244 = (undefined4)((ulong)local_208._M_dataplus._M_p >> 0x20);
          }
          value_01.value._4_1_ = (undefined1)uStack_24c;
          value_01.value._5_1_ = uStack_24c._1_1_;
          value_01.value._6_1_ = uStack_24c._2_1_;
          value_01.value._7_1_ = uStack_24c._3_1_;
          value_01.value.pointer.length = local_250;
          value_01.value._8_4_ = uStack_248;
          value_01.value._12_4_ = uStack_244;
          BaseAppender::Append<duckdb::string_t>(&errors_appender->super_BaseAppender,value_01);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p != &local_208.field_2) {
            operator_delete(local_208._M_dataplus._M_p);
          }
          pcVar2 = (((string *)(this_00 + -7))->_M_dataplus)._M_p;
          local_260 = (uint)this_00[-6].index;
          if (local_260 < 0xd) {
            uStack_254 = 0;
            uStack_25c = 0;
            uStack_258 = 0;
            if (local_260 != 0) {
              switchD_012e1ce8::default(&uStack_25c,pcVar2,(ulong)(local_260 & 0xf));
            }
          }
          else {
            uStack_25c = *(undefined4 *)pcVar2;
            uStack_258 = SUB84(pcVar2,0);
            uStack_254 = (undefined4)((ulong)pcVar2 >> 0x20);
          }
          value_00.value._4_1_ = (undefined1)uStack_25c;
          value_00.value._5_1_ = uStack_25c._1_1_;
          value_00.value._6_1_ = uStack_25c._2_1_;
          value_00.value._7_1_ = uStack_25c._3_1_;
          value_00.value.pointer.length = local_260;
          value_00.value._8_4_ = uStack_258;
          value_00.value._12_4_ = uStack_254;
          BaseAppender::Append<duckdb::string_t>(&errors_appender->super_BaseAppender,value_00);
          pcVar2 = (((CSVError *)(this_00 + -0x11))->error_message)._M_dataplus._M_p;
          local_270 = (uint)this_00[-0x10].index;
          if (local_270 < 0xd) {
            uStack_264 = 0;
            uStack_26c = 0;
            uStack_268 = 0;
            if (local_270 != 0) {
              switchD_012e1ce8::default(&uStack_26c,pcVar2,(ulong)(local_270 & 0xf));
            }
          }
          else {
            uStack_26c = *(undefined4 *)pcVar2;
            uStack_268 = SUB84(pcVar2,0);
            uStack_264 = (undefined4)((ulong)pcVar2 >> 0x20);
          }
          value.value._4_1_ = (undefined1)uStack_26c;
          value.value._5_1_ = uStack_26c._1_1_;
          value.value._6_1_ = uStack_26c._2_1_;
          value.value._7_1_ = uStack_26c._3_1_;
          value.value.pointer.length = local_270;
          value.value._8_4_ = uStack_268;
          value.value._12_4_ = uStack_264;
          BaseAppender::Append<duckdb::string_t>(&errors_appender->super_BaseAppender,value);
          BaseAppender::EndRow(&errors_appender->super_BaseAppender);
        }
      }
    } while (((iVar3 == 3) || (iVar3 == 0)) &&
            (pCVar9 = (pointer)(this_00 + 1), this_00 = this_00 + 0x12, pCVar9 != local_210));
  }
  pthread_mutex_unlock(local_240);
  return;
}

Assistant:

void CSVErrorHandler::FillRejectsTable(InternalAppender &errors_appender, const idx_t file_idx, const idx_t scan_idx,
                                       const CSVFileScan &file, CSVRejectsTable &rejects,
                                       const MultiFileBindData &bind_data, const idx_t limit) {
	lock_guard<mutex> parallel_lock(main_mutex);
	// We first insert the file into the file scans table
	for (auto &error : file.error_handler->errors) {
		if (!IsCSVErrorAcceptedReject(error.type)) {
			continue;
		}
		// short circuit if we already have too many rejects
		if (limit == 0 || rejects.count < limit) {
			if (limit != 0 && rejects.count >= limit) {
				break;
			}
			rejects.count++;
			const auto row_line = file.error_handler->GetLineInternal(error.error_info);
			const auto col_idx = error.column_idx;
			// Add the row to the rejects table
			errors_appender.BeginRow();
			// 1. Scan ID
			errors_appender.Append(scan_idx);
			// 2. File ID
			errors_appender.Append(file_idx);
			// 3. Row Line
			errors_appender.Append(row_line);
			// 4. Byte Position of the row error
			errors_appender.Append(error.row_byte_position + 1);
			// 5. Byte Position where error occurred
			if (!error.byte_position.IsValid()) {
				// This means this error comes from a flush, and we don't support this yet, so we give it
				// a null
				errors_appender.Append(Value());
			} else {
				errors_appender.Append(error.byte_position.GetIndex() + 1);
			}
			// 6. Column Index
			if (error.type == CSVErrorType::MAXIMUM_LINE_SIZE) {
				errors_appender.Append(Value());
			} else {
				errors_appender.Append(col_idx + 1);
			}
			// 7. Column Name (If Applicable)
			switch (error.type) {
			case CSVErrorType::TOO_MANY_COLUMNS:
			case CSVErrorType::MAXIMUM_LINE_SIZE:
				errors_appender.Append(Value());
				break;
			case CSVErrorType::TOO_FEW_COLUMNS:
				if (col_idx + 1 < bind_data.names.size()) {
					errors_appender.Append(string_t(bind_data.names[col_idx + 1]));
				} else {
					errors_appender.Append(Value());
				}
				break;
			default:
				if (col_idx < bind_data.names.size()) {
					errors_appender.Append(string_t(bind_data.names[col_idx]));
				} else {
					errors_appender.Append(Value());
				}
			}
			// 8. Error Type
			errors_appender.Append(string_t(CSVErrorTypeToEnum(error.type)));
			// 9. Original CSV Line
			errors_appender.Append(string_t(error.csv_row));
			// 10. Full Error Message
			errors_appender.Append(string_t(error.error_message));
			errors_appender.EndRow();
		}
	}
}